

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  int iVar1;
  string *value1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldDescriptor *this;
  FieldDescriptor *pFVar5;
  int32 value;
  int32 value_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  string local_88;
  string local_68;
  string local_48;
  
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    pDVar4 = FieldDescriptor::message_type(field);
    this = Descriptor::FindFieldByNumber(pDVar4,1);
    pDVar4 = FieldDescriptor::message_type(field);
    pFVar5 = Descriptor::FindFieldByNumber(pDVar4,2);
    value1 = *(string **)field;
    TypeName_abi_cxx11_(&local_88,(ruby *)this,field_01);
    TypeName_abi_cxx11_(&local_68,(ruby *)pFVar5,field_02);
    IntToString_abi_cxx11_(&local_48,(ruby *)(ulong)*(uint *)(field + 0x38),value);
    io::Printer::Print(printer,"map :$name$, :$key_type$, :$value_type$, $number$","name",value1,
                       "key_type",&local_88,"value_type",&local_68,"number",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    TVar3 = FieldDescriptor::type(pFVar5);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
LAB_002497f8:
      pDVar4 = FieldDescriptor::message_type(pFVar5);
      goto LAB_0024982e;
    }
    TVar3 = FieldDescriptor::type(pFVar5);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  }
  else {
    LabelForField_abi_cxx11_(&local_88,(ruby *)field,field_00);
    io::Printer::Print(printer,"$label$ :$name$, ","label",&local_88,"name",*(string **)field);
    pFVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      pFVar5 = extraout_RDX_00;
    }
    TypeName_abi_cxx11_(&local_88,(ruby *)field,pFVar5);
    IntToString_abi_cxx11_(&local_68,(ruby *)(ulong)*(uint *)(field + 0x38),value_00);
    io::Printer::Print(printer,":$type$, $number$","type",&local_88,"number",&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    TVar3 = FieldDescriptor::type(field);
    pFVar5 = field;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) goto LAB_002497f8;
    TVar3 = FieldDescriptor::type(field);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  }
  if (iVar1 != 8) {
    io::Printer::Print(printer,"\n");
    return;
  }
  pDVar4 = (Descriptor *)FieldDescriptor::enum_type(pFVar5);
LAB_0024982e:
  io::Printer::Print(printer,", \"$subtype$\"\n","subtype",*(string **)(pDVar4 + 8));
  return;
}

Assistant:

void GenerateField(const google::protobuf::FieldDescriptor* field,
                   google::protobuf::io::Printer* printer) {

  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", IntToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", IntToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  }
}